

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPrintVisitor.cpp
# Opt level: O2

void __thiscall CPrintVisitor::AddLabel(CPrintVisitor *this,string *label)

{
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)label);
  ConstructLabel(&local_50,(CPrintVisitor *)label,&local_30,this->lastVisited + 1);
  std::__cxx11::string::append((string *)&this->description);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void CPrintVisitor::AddLabel(std::string label) {
	this->description += ConstructLabel(label, lastVisited + 1);
}